

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlRegisterOutputCallbacks
              (xmlOutputMatchCallback matchFunc,xmlOutputOpenCallback openFunc,
              xmlOutputWriteCallback writeFunc,xmlOutputCloseCallback closeFunc)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)xmlOutputCallbackNr;
  iVar1 = -1;
  if (lVar2 < 0xf) {
    xmlOutputCallbackTable[lVar2].matchcallback = matchFunc;
    xmlOutputCallbackTable[lVar2].opencallback = openFunc;
    xmlOutputCallbackTable[lVar2].writecallback = writeFunc;
    xmlOutputCallbackTable[lVar2].closecallback = closeFunc;
    xmlOutputCallbackInitialized = 1;
    iVar1 = xmlOutputCallbackNr;
    xmlOutputCallbackNr = xmlOutputCallbackNr + 1;
  }
  return iVar1;
}

Assistant:

int
xmlRegisterOutputCallbacks(xmlOutputMatchCallback matchFunc,
	xmlOutputOpenCallback openFunc, xmlOutputWriteCallback writeFunc,
	xmlOutputCloseCallback closeFunc) {
    if (xmlOutputCallbackNr >= MAX_OUTPUT_CALLBACK) {
	return(-1);
    }
    xmlOutputCallbackTable[xmlOutputCallbackNr].matchcallback = matchFunc;
    xmlOutputCallbackTable[xmlOutputCallbackNr].opencallback = openFunc;
    xmlOutputCallbackTable[xmlOutputCallbackNr].writecallback = writeFunc;
    xmlOutputCallbackTable[xmlOutputCallbackNr].closecallback = closeFunc;
    xmlOutputCallbackInitialized = 1;
    return(xmlOutputCallbackNr++);
}